

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

unsigned_long
capnp::(anonymous_namespace)::checkRoundTripFromFloat<unsigned_long,double>(double value)

{
  bool bVar1;
  undefined1 auVar2 [16];
  Fault local_100;
  Fault f_2;
  DebugExpression<double> local_f0;
  undefined1 local_e8 [8];
  DebugComparison<double,_double_&> _kjCondition_2;
  unsigned_long result;
  Fault f_1;
  double *local_a8;
  undefined1 local_a0 [8];
  DebugComparison<double_&,_double> _kjCondition_1;
  Fault local_68;
  Fault f;
  double *local_58;
  undefined1 local_50 [8];
  DebugComparison<double_&,_double> _kjCondition;
  unsigned_long MAX;
  unsigned_long MIN;
  double value_local;
  
  _kjCondition.result = true;
  _kjCondition._33_7_ = 0xffffffffffffff;
  MIN = (unsigned_long)value;
  local_58 = (double *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(double *)&MIN);
  f.exception = (Exception *)0x0;
  kj::_::DebugExpression<double&>::operator>=
            ((DebugComparison<double_&,_double> *)local_50,(DebugExpression<double&> *)&local_58,
             (double *)&f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (bVar1) {
    local_a8 = (double *)
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(double *)&MIN);
    f_1.exception = (Exception *)0x43f0000000000000;
    kj::_::DebugExpression<double&>::operator<=
              ((DebugComparison<double_&,_double> *)local_a0,(DebugExpression<double&> *)&local_a8,
               (double *)&f_1);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a0);
    if (bVar1) {
      _kjCondition_2._32_8_ =
           (long)(double)MIN |
           (long)((double)MIN - 9.223372036854776e+18) & (long)(double)MIN >> 0x3f;
      auVar2._8_4_ = (int)((ulong)_kjCondition_2._32_8_ >> 0x20);
      auVar2._0_8_ = _kjCondition_2._32_8_;
      auVar2._12_4_ = 0x45300000;
      f_2.exception =
           (Exception *)
           ((auVar2._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)_kjCondition_2._32_8_) - 4503599627370496.0));
      local_f0 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(double *)&f_2);
      kj::_::DebugExpression<double>::operator==
                ((DebugComparison<double,_double_&> *)local_e8,&local_f0,(double *)&MIN);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e8);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<double,double&>&,char_const(&)[39],double&>
                  (&local_100,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x6df,FAILED,"U(result) == value",
                   "_kjCondition,\"Value out-of-range for requested type.\", value",
                   (DebugComparison<double,_double_&> *)local_e8,
                   (char (*) [39])"Value out-of-range for requested type.",(double *)&MIN);
        kj::_::Debug::Fault::~Fault(&local_100);
      }
      value_local = (double)_kjCondition_2._32_8_;
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<double&,double>&,char_const(&)[39],double&>
                ((Fault *)&result,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x6db,FAILED,"value <= U(MAX)",
                 "_kjCondition,\"Value out-of-range for requested type.\", value",
                 (DebugComparison<double_&,_double> *)local_a0,
                 (char (*) [39])"Value out-of-range for requested type.",(double *)&MIN);
      value_local = -NAN;
      kj::_::Debug::Fault::~Fault((Fault *)&result);
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<double&,double>&,char_const(&)[39],double&>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x6d8,FAILED,"value >= U(MIN)",
               "_kjCondition,\"Value out-of-range for requested type.\", value",
               (DebugComparison<double_&,_double> *)local_50,
               (char (*) [39])"Value out-of-range for requested type.",(double *)&MIN);
    value_local = 0.0;
    kj::_::Debug::Fault::~Fault(&local_68);
  }
  return (unsigned_long)value_local;
}

Assistant:

T checkRoundTripFromFloat(U value) {
  // When `U` is `float` or `double`, we have to use a different approach, because casting an
  // out-of-range float to an integer is, surprisingly, UB.
  constexpr T MIN = kj::minValue;
  constexpr T MAX = kj::maxValue;
  KJ_REQUIRE(value >= U(MIN), "Value out-of-range for requested type.", value) {
    return MIN;
  }
  KJ_REQUIRE(value <= U(MAX), "Value out-of-range for requested type.", value) {
    return MAX;
  }
  T result = value;
  KJ_REQUIRE(U(result) == value, "Value out-of-range for requested type.", value) {
    // Use it anyway.
    break;
  }
  return result;
}